

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query.cc
# Opt level: O3

bool __thiscall
S2ClosestCellQuery::IsDistanceLess(S2ClosestCellQuery *this,Target *target,S1ChordAngle limit)

{
  undefined1 uVar1;
  undefined3 uVar2;
  Options local_58;
  Result local_30;
  
  local_58.max_error_.length2_ = (this->options_).super_Options.max_error_.length2_;
  local_58.region_ = (this->options_).super_Options.region_;
  uVar1 = (this->options_).super_Options.use_brute_force_;
  uVar2 = *(undefined3 *)&(this->options_).super_Options.field_0x1d;
  local_58._29_3_ = uVar2;
  local_58.use_brute_force_ = (bool)uVar1;
  local_58.max_results_ = 1;
  local_58.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)limit.length2_;
  S1ChordAngle::S1ChordAngle(&local_58.max_error_,4.0);
  S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell(&local_30,&this->base_,target,&local_58);
  return local_30.cell_id_.id_ != 0;
}

Assistant:

bool S2ClosestCellQuery::IsDistanceLess(Target* target, S1ChordAngle limit) {
  static_assert(sizeof(Options) <= 32, "Consider not copying Options here");
  Options tmp_options = options_;
  tmp_options.set_max_results(1);
  tmp_options.set_max_distance(limit);
  tmp_options.set_max_error(S1ChordAngle::Straight());
  return !base_.FindClosestCell(target, tmp_options).is_empty();
}